

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O2

ion_err_t sl_initialize(ion_skiplist_t *skiplist,ion_key_type_t key_type,int key_size,int value_size
                       ,int maxheight,int pnum,int pden)

{
  ion_sl_node_t *__ptr;
  sl_node **ppsVar1;
  ulong uVar2;
  ion_err_t iVar3;
  
  (skiplist->super).key_type = key_type;
  (skiplist->super).record.key_size = key_size;
  (skiplist->super).record.value_size = value_size;
  skiplist->maxheight = maxheight;
  skiplist->pden = pden;
  skiplist->pnum = pnum;
  __ptr = (ion_sl_node_t *)malloc(0x20);
  skiplist->head = __ptr;
  iVar3 = '\x06';
  if (__ptr != (ion_sl_node_t *)0x0) {
    ppsVar1 = (sl_node **)malloc((long)maxheight << 5);
    __ptr->next = ppsVar1;
    if (ppsVar1 == (sl_node **)0x0) {
      free(__ptr);
      skiplist->head = (ion_sl_node_t *)0x0;
    }
    else {
      __ptr->height = maxheight + -1;
      __ptr->key = (ion_key_t)0x0;
      __ptr->value = (ion_value_t)0x0;
      for (uVar2 = (ulong)(uint)maxheight; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
        skiplist->head->next[uVar2 - 1] = (sl_node *)0x0;
      }
      iVar3 = '\0';
    }
  }
  return iVar3;
}

Assistant:

ion_err_t
sl_initialize(
	ion_skiplist_t	*skiplist,
	ion_key_type_t	key_type,
	int				key_size,
	int				value_size,
	int				maxheight,
	int				pnum,
	int				pden
) {
	/* srand(time(NULL)); */

	skiplist->super.key_type			= key_type;
	skiplist->super.record.key_size		= key_size;
	skiplist->super.record.value_size	= value_size;
	skiplist->maxheight					= maxheight;

	skiplist->pden						= pden;
	skiplist->pnum						= pnum;

#if ION_DEBUG
	DUMP(skip_list->super.record.key_size, "%d");
	DUMP(skip_list->super.record.value_size, "%d");
	DUMP(skip_list->maxheight, "%d");
	DUMP(skip_list->pnum, "%d");
	DUMP(skip_list->pden, "%d");
	printf("%s", "\n");
#endif

	skiplist->head = malloc(sizeof(ion_sl_node_t));

	if (NULL == skiplist->head) {
		return err_out_of_memory;
	}

	skiplist->head->next = malloc(sizeof(ion_sl_node_t) * skiplist->maxheight);

	if (NULL == skiplist->head->next) {
		free(skiplist->head);
		skiplist->head = NULL;
		return err_out_of_memory;
	}

	skiplist->head->height	= maxheight - 1;
	skiplist->head->key		= NULL;
	skiplist->head->value	= NULL;

	while (--maxheight >= 0) {
		skiplist->head->next[maxheight] = NULL;
	}

	return err_ok;
}